

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

void __thiscall AliHttpRequest::~AliHttpRequest(AliHttpRequest *this)

{
  this->_vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_0020eae0;
  if (this->connection_ != (AliConnection *)0x0) {
    (*this->connection_->_vptr_AliConnection[3])();
  }
  free(this->parser_);
  std::__cxx11::string::~string((string *)&this->last_response_value_);
  std::__cxx11::string::~string((string *)&this->last_response_field_);
  std::__cxx11::string::~string((string *)&this->proxy_host_);
  std::__cxx11::string::~string((string *)&this->resposne_body_);
  std::__cxx11::string::~string((string *)&this->sechema_);
  std::__cxx11::string::~string((string *)&this->path_);
  std::__cxx11::string::~string((string *)&this->port_);
  std::__cxx11::string::~string((string *)&this->host_);
  std::__cxx11::string::~string((string *)&this->flagment_);
  std::__cxx11::string::~string((string *)&this->query_);
  std::__cxx11::string::~string((string *)&this->url_);
  std::__cxx11::string::~string((string *)&this->method_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->map_reponse_headers_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->map_request_headers_)._M_t);
  return;
}

Assistant:

AliHttpRequest::~AliHttpRequest() {
  if(this->connection_) {
    this->connection_->Close();
  }
  free(parser_);
}